

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1_custom_app_return_codes.cpp
# Opt level: O0

int main(void)

{
  throw_std_exception();
  return 0;
}

Assistant:

int main() try // Function try block
{
   throw_std_exception();
	return EXIT_SUCCESS;
}
catch (...)
{
   using namespace mittens;
   return all_catcher(-1, std_exception_handler(-2, bad_alloc_handler(-3))).handleException(); 
}